

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall
CConfigManager::RegisterCallback(CConfigManager *this,SAVECALLBACKFUNC pfnFunc,void *pUserData)

{
  int iVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/config.cpp"
                 ,0x7b,(uint)(this->m_NumCallbacks < 0x10),"too many config callbacks");
  iVar1 = this->m_NumCallbacks;
  this->m_aCallbacks[iVar1].m_pfnFunc = pfnFunc;
  this->m_aCallbacks[iVar1].m_pUserData = pUserData;
  this->m_NumCallbacks = iVar1 + 1;
  return;
}

Assistant:

void CConfigManager::RegisterCallback(SAVECALLBACKFUNC pfnFunc, void *pUserData)
{
	dbg_assert(m_NumCallbacks < MAX_CALLBACKS, "too many config callbacks");
	m_aCallbacks[m_NumCallbacks].m_pfnFunc = pfnFunc;
	m_aCallbacks[m_NumCallbacks].m_pUserData = pUserData;
	m_NumCallbacks++;
}